

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_promise_finally(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  int *piVar2;
  int64_t iVar3;
  JSValue JVar4;
  JSValueUnion JVar5;
  ulong uVar6;
  int iVar7;
  JSRefCountHeader *p;
  uint uVar8;
  uint uVar9;
  JSRefCountHeader *p_1;
  char cVar10;
  JSValue v;
  JSValue JVar11;
  JSValueUnion local_78 [2];
  JSValueUnion local_68;
  JSValue local_58;
  int *local_48;
  int64_t local_40;
  
  piVar2 = (int *)(argv->u).ptr;
  iVar3 = argv->tag;
  JVar4 = *argv;
  JVar11 = *argv;
  v = JS_SpeciesConstructor(ctx,this_val,(JSValue)(ZEXT816(3) << 0x40));
  JVar5 = v.u;
  uVar9 = (uint)v.tag;
  if (uVar9 == 6) {
    uVar6 = (ulong)JVar5.ptr & 0xffffffff00000000;
    goto LAB_00147512;
  }
  uVar8 = (uint)iVar3;
  if (uVar8 == 0xffffffff) {
    uVar1 = *(ushort *)((long)piVar2 + 6);
    if (uVar1 != 0xd) {
      if (uVar1 == 0x29) {
        cVar10 = *(char *)(*(long *)(piVar2 + 0xc) + 0x20);
      }
      else {
        cVar10 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
      }
      if (cVar10 == '\0') goto LAB_0014743c;
    }
    local_58 = v;
    local_48 = piVar2;
    local_40 = iVar3;
    local_78 = (JSValueUnion  [2])
               JS_NewCFunctionData(ctx,js_promise_then_finally_func,1,0,2,&local_58);
    iVar7 = local_78[1]._0_4_;
    if (iVar7 != 6) {
      _local_68 = JS_NewCFunctionData(ctx,js_promise_then_finally_func,1,1,2,&local_58);
      if (local_68._8_4_ != 6) goto LAB_00147465;
      if ((iVar7 != 6) && (0xfffffff4 < local_78[1]._0_4_)) {
        iVar7 = *local_78[0].ptr;
        *(int *)local_78[0].ptr = iVar7 + -1;
        if (iVar7 < 2) {
          __JS_FreeValueRT(ctx->rt,(JSValue)local_78);
        }
      }
    }
    if ((0xfffffff4 < uVar9) && (iVar7 = *JVar5.ptr, *(int *)JVar5.ptr = iVar7 + -1, iVar7 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
    uVar6 = 0;
    v = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
LAB_0014743c:
    local_78 = (JSValueUnion  [2])JVar4;
    _local_68 = JVar11;
    if (0xfffffff4 < uVar8) {
      *piVar2 = *piVar2 + 2;
    }
LAB_00147465:
    if ((0xfffffff4 < uVar9) && (iVar7 = *JVar5.ptr, *(int *)JVar5.ptr = iVar7 + -1, iVar7 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
    v = JS_Invoke(ctx,this_val,0x7f,2,(JSValue *)local_78);
    if (0xfffffff4 < local_78[1]._0_4_) {
      iVar7 = *local_78[0].ptr;
      *(int *)local_78[0].ptr = iVar7 + -1;
      if (iVar7 < 2) {
        __JS_FreeValueRT(ctx->rt,(JSValue)local_78);
      }
    }
    if (0xfffffff4 < local_68._8_4_) {
      iVar7 = *local_68.ptr;
      *(int *)local_68.ptr = iVar7 + -1;
      if (iVar7 < 2) {
        __JS_FreeValueRT(ctx->rt,_local_68);
      }
    }
    uVar6 = (ulong)v.u.ptr & 0xffffffff00000000;
  }
LAB_00147512:
  JVar11.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar6);
  JVar11.tag = v.tag;
  return JVar11;
}

Assistant:

static JSValue js_promise_finally(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValueConst onFinally = argv[0];
    JSValue ctor, ret;
    JSValue then_funcs[2];
    JSValueConst func_data[2];
    int i;

    ctor = JS_SpeciesConstructor(ctx, this_val, JS_UNDEFINED);
    if (JS_IsException(ctor))
        return ctor;
    if (!JS_IsFunction(ctx, onFinally)) {
        then_funcs[0] = JS_DupValue(ctx, onFinally);
        then_funcs[1] = JS_DupValue(ctx, onFinally);
    } else {
        func_data[0] = ctor;
        func_data[1] = onFinally;
        for(i = 0; i < 2; i++) {
            then_funcs[i] = JS_NewCFunctionData(ctx, js_promise_then_finally_func, 1, i, 2, func_data);
            if (JS_IsException(then_funcs[i])) {
                if (i == 1)
                    JS_FreeValue(ctx, then_funcs[0]);
                JS_FreeValue(ctx, ctor);
                return JS_EXCEPTION;
            }
        }
    }
    JS_FreeValue(ctx, ctor);
    ret = JS_Invoke(ctx, this_val, JS_ATOM_then, 2, (JSValueConst *)then_funcs);
    JS_FreeValue(ctx, then_funcs[0]);
    JS_FreeValue(ctx, then_funcs[1]);
    return ret;
}